

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

Cookie * Curl_cookie_add(Curl_easy *data,CookieInfo *ci,_Bool httpheader,_Bool noexpire,
                        char *lineptr,char *domain,char *path,_Bool secure)

{
  int iVar1;
  char *pcVar2;
  _Bool local_55;
  int local_54;
  _Bool replaces;
  size_t sStack_50;
  int rc;
  size_t myhash;
  Cookie *co;
  char *pcStack_38;
  _Bool secure_local;
  char *domain_local;
  char *lineptr_local;
  _Bool noexpire_local;
  CookieInfo *pCStack_20;
  _Bool httpheader_local;
  CookieInfo *ci_local;
  Curl_easy *data_local;
  
  co._7_1_ = secure;
  local_55 = false;
  if (((data->req).setcookies < 0x32) &&
     (pcStack_38 = domain, domain_local = lineptr, lineptr_local._6_1_ = noexpire,
     lineptr_local._7_1_ = httpheader, pCStack_20 = ci, ci_local = (CookieInfo *)data,
     myhash = (size_t)(*Curl_ccalloc)(1,0x78), (Cookie *)myhash != (Cookie *)0x0)) {
    if ((lineptr_local._7_1_ & 1) == 0) {
      local_54 = parse_netscape((Cookie *)myhash,pCStack_20,domain_local,(_Bool)(co._7_1_ & 1));
    }
    else {
      local_54 = parse_cookie_header((Curl_easy *)ci_local,(Cookie *)myhash,pCStack_20,domain_local,
                                     pcStack_38,path,(_Bool)(co._7_1_ & 1));
    }
    if ((((local_54 == 0) &&
         (((*(byte *)(myhash + 0x74) >> 4 & 1) == 0 || ((*(byte *)(myhash + 0x74) >> 1 & 1) != 0))))
        && (((*(byte *)(myhash + 0x74) >> 5 & 1) == 0 ||
            (((((*(byte *)(myhash + 0x74) >> 1 & 1) != 0 && (*(long *)(myhash + 0x50) != 0)) &&
              (iVar1 = strcmp(*(char **)(myhash + 0x50),"/"), iVar1 == 0)) &&
             ((*(byte *)(myhash + 0x74) & 1) == 0)))))) &&
       ((((pCStack_20->running & 1U) != 0 || ((pCStack_20->newsession & 1U) == 0)) ||
        (*(long *)(myhash + 0x68) != 0)))) {
      *(byte *)(myhash + 0x74) = *(byte *)(myhash + 0x74) & 0xfb | (pCStack_20->running & 1U) << 2;
      iVar1 = pCStack_20->lastct + 1;
      pCStack_20->lastct = iVar1;
      *(int *)(myhash + 0x70) = iVar1;
      if ((lineptr_local._6_1_ & 1) == 0) {
        remove_expired(pCStack_20);
      }
      iVar1 = is_public_suffix((Curl_easy *)ci_local,(Cookie *)myhash,pcStack_38);
      if ((iVar1 == 0) &&
         (iVar1 = replace_existing((Curl_easy *)ci_local,(Cookie *)myhash,pCStack_20,
                                   (_Bool)(co._7_1_ & 1),&local_55), iVar1 == 0)) {
        sStack_50 = cookiehash(*(char **)(myhash + 0x60));
        Curl_llist_append(pCStack_20->cookielist + sStack_50,(void *)myhash,
                          (Curl_llist_node *)myhash);
        if ((((pCStack_20->running & 1U) != 0) &&
            ((ci_local != (CookieInfo *)0x0 &&
             ((*(ulong *)((long)&ci_local[1].cookielist[0x15]._head + 2) >> 0x1c & 1) != 0)))) &&
           ((ci_local[2].cookielist[0x19]._size == 0 ||
            (0 < *(int *)(ci_local[2].cookielist[0x19]._size + 8))))) {
          pcVar2 = "Added";
          if ((local_55 & 1U) != 0) {
            pcVar2 = "Replaced";
          }
          Curl_infof((Curl_easy *)ci_local,"%s cookie %s=\"%s\" for domain %s, path %s, expire %ld",
                     pcVar2,*(undefined8 *)(myhash + 0x40),*(undefined8 *)(myhash + 0x48),
                     *(undefined8 *)(myhash + 0x60),*(undefined8 *)(myhash + 0x50),
                     *(undefined8 *)(myhash + 0x68));
        }
        if ((local_55 & 1U) == 0) {
          pCStack_20->numcookies = pCStack_20->numcookies + 1;
        }
        if ((*(long *)(myhash + 0x68) != 0) &&
           (*(long *)(myhash + 0x68) < pCStack_20->next_expiration)) {
          pCStack_20->next_expiration = *(curl_off_t *)(myhash + 0x68);
        }
        return (Cookie *)myhash;
      }
    }
    freecookie((Cookie *)myhash);
  }
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *
Curl_cookie_add(struct Curl_easy *data,
                struct CookieInfo *ci,
                bool httpheader, /* TRUE if HTTP header-style line */
                bool noexpire, /* if TRUE, skip remove_expired() */
                const char *lineptr,   /* first character of the line */
                const char *domain, /* default domain */
                const char *path,   /* full path used when this cookie is set,
                                       used to get default path for the cookie
                                       unless set */
                bool secure)  /* TRUE if connection is over secure origin */
{
  struct Cookie *co;
  size_t myhash;
  int rc;
  bool replaces = FALSE;

  DEBUGASSERT(data);
  DEBUGASSERT(MAX_SET_COOKIE_AMOUNT <= 255); /* counter is an unsigned char */
  if(data->req.setcookies >= MAX_SET_COOKIE_AMOUNT)
    return NULL;

  /* First, alloc and init a new struct for it */
  co = calloc(1, sizeof(struct Cookie));
  if(!co)
    return NULL; /* bail out if we are this low on memory */

  if(httpheader)
    rc = parse_cookie_header(data, co, ci, lineptr, domain, path, secure);
  else
    rc = parse_netscape(co, ci, lineptr, secure);

  if(rc)
    goto fail;

  if(co->prefix_secure && !co->secure)
    /* The __Secure- prefix only requires that the cookie be set secure */
    goto fail;

  if(co->prefix_host) {
    /*
     * The __Host- prefix requires the cookie to be secure, have a "/" path
     * and not have a domain set.
     */
    if(co->secure && co->path && strcmp(co->path, "/") == 0 && !co->tailmatch)
      ;
    else
      goto fail;
  }

  if(!ci->running &&    /* read from a file */
     ci->newsession &&  /* clean session cookies */
     !co->expires)      /* this is a session cookie since it does not expire */
    goto fail;

  co->livecookie = ci->running;
  co->creationtime = ++ci->lastct;

  /*
   * Now we have parsed the incoming line, we must now check if this supersedes
   * an already existing cookie, which it may if the previous have the same
   * domain and path as this.
   */

  /* remove expired cookies */
  if(!noexpire)
    remove_expired(ci);

  if(is_public_suffix(data, co, domain))
    goto fail;

  if(replace_existing(data, co, ci, secure, &replaces))
    goto fail;

  /* add this cookie to the list */
  myhash = cookiehash(co->domain);
  Curl_llist_append(&ci->cookielist[myhash], co, &co->node);

  if(ci->running)
    /* Only show this when NOT reading the cookies from a file */
    infof(data, "%s cookie %s=\"%s\" for domain %s, path %s, "
          "expire %" FMT_OFF_T,
          replaces ? "Replaced":"Added", co->name, co->value,
          co->domain, co->path, co->expires);

  if(!replaces)
    ci->numcookies++; /* one more cookie in the jar */

  /*
   * Now that we have added a new cookie to the jar, update the expiration
   * tracker in case it is the next one to expire.
   */
  if(co->expires && (co->expires < ci->next_expiration))
    ci->next_expiration = co->expires;

  return co;
fail:
  freecookie(co);
  return NULL;
}